

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::FloorFun::GetFunctions(void)

{
  LogicalTypeId LVar1;
  LogicalType varargs;
  bool bVar2;
  InternalException *this;
  ScalarFunctionSet *in_RDI;
  code *pcVar3;
  LogicalType *this_00;
  initializer_list<duckdb::LogicalType> __l;
  scalar_function_t func;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdbc;
  FunctionNullHandling in_stack_fffffffffffffdc8;
  allocator_type local_231;
  _Any_data local_228;
  code *local_218;
  undefined8 uStack_210;
  _func_int **local_208;
  vector<duckdb::ScalarFunction,_true> *local_200;
  string local_1f8;
  LogicalType *local_1d8;
  LogicalType *local_1d0;
  _Any_data local_1c0;
  code *local_1b0;
  LogicalType local_1a0;
  vector<duckdb::LogicalType,_true> local_188;
  LogicalType local_170;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Numeric();
  if (local_1d8 != local_1d0) {
    local_200 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_208 = (_func_int **)&PTR__ScalarFunction_01963628;
    this_00 = local_1d8;
    do {
      local_218 = (code *)0x0;
      uStack_210 = 0;
      local_228._M_unused._M_object = (void *)0x0;
      local_228._8_8_ = 0;
      bVar2 = LogicalType::IsIntegral(this_00);
      if (!bVar2) {
        LVar1 = this_00->id_;
        pcVar3 = BindGenericRoundFunctionDecimal<duckdb::FloorDecimalOperator>;
        if (LVar1 != DECIMAL) {
          pcVar3 = ScalarFunction::UnaryFunction<float,float,duckdb::FloorOperator>;
          if (LVar1 != FLOAT) {
            if (LVar1 != DOUBLE) {
              this = (InternalException *)__cxa_allocate_exception(0x10);
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f8,"Unimplemented numeric type for function \"floor\"",""
                        );
              InternalException::InternalException(this,&local_1f8);
              __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pcVar3 = ScalarFunction::UnaryFunction<double,double,duckdb::FloorOperator>;
          }
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_228._M_pod_data,pcVar3);
          pcVar3 = (bind_scalar_function_t)0x0;
        }
        LogicalType::LogicalType((LogicalType *)&local_1f8,this_00);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_1f8;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188,
                   __l,&local_231);
        LogicalType::LogicalType(&local_1a0,this_00);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_1c0,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_228);
        LogicalType::LogicalType(&local_170,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_170;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffdb4;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffdbc;
        ScalarFunction::ScalarFunction
                  (&local_158,&local_188,&local_1a0,(scalar_function_t *)&local_1c0,pcVar3,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffdc8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_200->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_208;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                     __destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_170);
        if (local_1b0 != (code *)0x0) {
          (*local_1b0)(&local_1c0,&local_1c0,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_1a0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_188);
        LogicalType::~LogicalType((LogicalType *)&local_1f8);
      }
      if (local_218 != (code *)0x0) {
        (*local_218)(&local_228,&local_228,__destroy_functor);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_1d0);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1d8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet FloorFun::GetFunctions() {
	ScalarFunctionSet floor;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		if (type.IsIntegral()) {
			// no floor for integral numbers
			continue;
		}
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			func = ScalarFunction::UnaryFunction<float, float, FloorOperator>;
			break;
		case LogicalTypeId::DOUBLE:
			func = ScalarFunction::UnaryFunction<double, double, FloorOperator>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<FloorDecimalOperator>;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"floor\"");
		}
		floor.AddFunction(ScalarFunction({type}, type, func, bind_func));
	}
	return floor;
}